

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

Token lex(ptrlen *text,ptrlen *token,char **err)

{
  char *ptr;
  _Bool _Var1;
  char *pcVar2;
  char *pcVar3;
  ptrlen pVar4;
  _Bool local_81;
  _Bool local_71;
  void *local_70;
  size_t local_68;
  operator *op;
  size_t i;
  char *start;
  Token type;
  char *e;
  char *p;
  char **err_local;
  ptrlen *token_local;
  ptrlen *text_local;
  
  e = (char *)text->ptr;
  pcVar2 = e + text->len;
  while( true ) {
    ptr = e;
    local_71 = false;
    if (e < pcVar2) {
      local_71 = is_space(*e);
    }
    if (local_71 == false) break;
    e = e + 1;
  }
  if (e < pcVar2) {
    _Var1 = is_operator_char(*e);
    if (_Var1) {
      for (op = (operator *)0x0; op < (operator *)0x5; op = (operator *)((long)&(op->text).ptr + 1))
      {
        if (lex::operators[(long)op].text.len <= (ulong)((long)pcVar2 - (long)e)) {
          pVar4 = make_ptrlen(e,lex::operators[(long)op].text.len);
          _Var1 = ptrlen_eq_ptrlen(lex::operators[(long)op].text,pVar4);
          if (_Var1) {
            e = e + lex::operators[(long)op].text.len;
            start._4_4_ = lex::operators[(long)op].type;
            goto LAB_001b1082;
          }
        }
      }
      e = e + 1;
      start._4_4_ = TOK_ERROR;
      pcVar3 = dupstr("unrecognised boolean operator");
      *err = pcVar3;
    }
    else {
      _Var1 = is_atom_char(*e);
      if (_Var1) {
        do {
          e = e + 1;
          local_81 = false;
          if (e < pcVar2) {
            local_81 = is_atom_char(*e);
          }
        } while (local_81 != false);
        start._4_4_ = TOK_ATOM;
      }
      else {
        e = e + 1;
        start._4_4_ = TOK_ERROR;
        pcVar3 = dupstr("unexpected character in expression");
        *err = pcVar3;
      }
    }
  }
  else {
    start._4_4_ = TOK_END;
  }
LAB_001b1082:
  pVar4 = make_ptrlen(ptr,(long)e - (long)ptr);
  local_70 = pVar4.ptr;
  token->ptr = local_70;
  local_68 = pVar4.len;
  token->len = local_68;
  text->ptr = e;
  text->len = (long)pcVar2 - (long)e;
  return start._4_4_;
}

Assistant:

static Token lex(ptrlen *text, ptrlen *token, char **err)
{
    const char *p = text->ptr, *e = p + text->len;
    Token type = TOK_ERROR;

    /* Skip whitespace */
    while (p < e && is_space(*p))
        p++;

    const char *start = p;

    if (!(p < e)) {
        type = TOK_END;
        goto out;
    }

    if (is_operator_char(*p)) {
        /* Match boolean-expression tokens */
        static const struct operator {
            ptrlen text;
            Token type;
        } operators[] = {
            {PTRLEN_DECL_LITERAL("("), TOK_LPAR},
            {PTRLEN_DECL_LITERAL(")"), TOK_RPAR},
            {PTRLEN_DECL_LITERAL("&&"), TOK_AND},
            {PTRLEN_DECL_LITERAL("||"), TOK_OR},
            {PTRLEN_DECL_LITERAL("!"), TOK_NOT},
        };

        for (size_t i = 0; i < lenof(operators); i++) {
            const struct operator *op = &operators[i];
            if (e - p >= op->text.len &&
                ptrlen_eq_ptrlen(op->text, make_ptrlen(p, op->text.len))) {
                p += op->text.len;
                type = op->type;
                goto out;
            }
        }

        /*
         * Report an error if one of the operator characters is used
         * in a way that doesn't match something in that table (e.g. a
         * single &).
         */
        p++;
        type = TOK_ERROR;
        *err = dupstr("unrecognised boolean operator");
        goto out;
    } else if (is_atom_char(*p)) {
        /*
         * Match an 'atom' token, which is any non-empty sequence of
         * characters from the combined set that allows hostname
         * wildcards, IP address ranges and special predicates like
         * port numbers.
         */
        do {
            p++;
        } while (p < e && is_atom_char(*p));

        type = TOK_ATOM;
        goto out;
    } else {
        /*
         * Otherwise, report an error.
         */
        p++;
        type = TOK_ERROR;
        *err = dupstr("unexpected character in expression");
        goto out;
    }

  out:
    *token = make_ptrlen(start, p - start);
    text->ptr = p;
    text->len = e - p;
    return type;
}